

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::CheckMultipleOutputs
          (cmLocalUnixMakefileGenerator3 *this,bool verbose)

{
  string *filename;
  cmMakefile *this_00;
  bool bVar1;
  cmValue cVar2;
  string *filename_00;
  string_view arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pairs;
  cmAlphaNum local_b0;
  cmAlphaNum local_80;
  string local_50;
  
  this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"CMAKE_MULTIPLE_OUTPUT_PAIRS",(allocator<char> *)&local_80);
  cVar2 = cmMakefile::GetDefinition(this_00,(string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  if (cVar2.Value != (string *)0x0) {
    arg._M_str = ((cVar2.Value)->_M_dataplus)._M_p;
    arg._M_len = (cVar2.Value)->_M_string_length;
    cmExpandedList_abi_cxx11_(&pairs,arg,true);
    filename_00 = pairs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1;
    while( true ) {
      filename = filename_00 + -1;
      if ((filename ==
           pairs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) ||
         (filename_00 ==
          pairs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)) break;
      bVar1 = cmsys::SystemTools::FileExists(filename_00);
      if (bVar1) {
        bVar1 = cmsys::SystemTools::FileExists(filename);
        if (!bVar1) {
          if (verbose) {
            local_b0.View_._M_len = (size_t)&DAT_00000028;
            local_b0.View_._M_str = "Deleting primary custom command output \"";
            local_80.View_._M_str = (filename_00->_M_dataplus)._M_p;
            local_80.View_._M_len = filename_00->_M_string_length;
            cmStrCat<char[27],std::__cxx11::string,char[19]>
                      (&local_50,&local_b0,&local_80,(char (*) [27])"\" because another output \"",
                       filename,(char (*) [19])"\" does not exist.\n");
            cmSystemTools::Stdout(&local_50);
            std::__cxx11::string::~string((string *)&local_50);
          }
          cmsys::SystemTools::RemoveFile(filename_00);
        }
      }
      filename_00 = filename_00 + 2;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&pairs);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::CheckMultipleOutputs(bool verbose)
{
  cmMakefile* mf = this->Makefile;

  // Get the string listing the multiple output pairs.
  cmValue pairs_string = mf->GetDefinition("CMAKE_MULTIPLE_OUTPUT_PAIRS");
  if (!pairs_string) {
    return;
  }

  // Convert the string to a list and preserve empty entries.
  std::vector<std::string> pairs = cmExpandedList(*pairs_string, true);
  for (auto i = pairs.begin(); i != pairs.end() && (i + 1) != pairs.end();) {
    const std::string& depender = *i++;
    const std::string& dependee = *i++;

    // If the depender is missing then delete the dependee to make
    // sure both will be regenerated.
    if (cmSystemTools::FileExists(dependee) &&
        !cmSystemTools::FileExists(depender)) {
      if (verbose) {
        cmSystemTools::Stdout(cmStrCat(
          "Deleting primary custom command output \"", dependee,
          "\" because another output \"", depender, "\" does not exist.\n"));
      }
      cmSystemTools::RemoveFile(dependee);
    }
  }
}